

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::GlobOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  idx_t iVar9;
  long lVar10;
  ulong uVar11;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  string_t *local_60;
  bool *local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long *local_40;
  ulong local_38;
  
  local_40 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = rdata;
  local_58 = result_data;
  if (local_40 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar10 = 8;
      iVar9 = 0;
      local_40 = (unsigned_long *)0x0;
      do {
        local_70 = *(ulong *)((long)ldata + lVar10 + -8);
        local_68 = *(char **)((long)&ldata->value + lVar10);
        local_80 = *(ulong *)((long)local_60 + lVar10 + -8);
        local_78 = *(char **)((long)&local_60->value + lVar10);
        pcVar7 = local_68;
        if ((local_70 & 0xffffffff) < 0xd) {
          pcVar7 = (char *)((long)&local_70 + 4);
        }
        pcVar2 = local_78;
        if ((local_80 & 0xffffffff) < 0xd) {
          pcVar2 = (char *)((long)&local_80 + 4);
        }
        bVar1 = Glob(pcVar7,local_70 & 0xffffffff,pcVar2,local_80 & 0xffffffff,true);
        local_58[iVar9] = bVar1;
        iVar9 = iVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_38 = 0;
    uVar5 = 0;
    local_48 = count;
    do {
      uVar3 = local_40[local_38];
      uVar8 = uVar5 + 0x40;
      if (local_48 <= uVar5 + 0x40) {
        uVar8 = local_48;
      }
      uVar6 = uVar8;
      if (uVar3 != 0) {
        uVar6 = uVar5;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar5 < uVar8) {
            uVar3 = uVar5 << 4 | 8;
            do {
              local_70 = *(ulong *)((long)ldata + (uVar3 - 8));
              local_68 = *(char **)((long)&ldata->value + uVar3);
              local_80 = *(ulong *)((long)local_60 + (uVar3 - 8));
              local_78 = *(char **)((long)&local_60->value + uVar3);
              pcVar7 = local_68;
              if ((local_70 & 0xffffffff) < 0xd) {
                pcVar7 = (char *)((long)&local_70 + 4);
              }
              pcVar2 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar2 = (char *)((long)&local_80 + 4);
              }
              bVar1 = Glob(pcVar7,local_70 & 0xffffffff,pcVar2,local_80 & 0xffffffff,true);
              local_58[uVar5] = bVar1;
              uVar5 = uVar5 + 1;
              uVar3 = uVar3 + 0x10;
              uVar6 = uVar5;
            } while (uVar8 != uVar5);
          }
        }
        else if (uVar5 < uVar8) {
          uVar4 = uVar5 << 4 | 8;
          uVar11 = 0;
          do {
            if ((uVar3 >> (uVar11 & 0x3f) & 1) != 0) {
              local_70 = *(ulong *)((long)ldata + (uVar4 - 8));
              local_68 = *(char **)((long)&ldata->value + uVar4);
              local_80 = *(ulong *)((long)local_60 + (uVar4 - 8));
              local_78 = *(char **)((long)&local_60->value + uVar4);
              pcVar7 = local_68;
              if ((local_70 & 0xffffffff) < 0xd) {
                pcVar7 = (char *)((long)&local_70 + 4);
              }
              pcVar2 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar2 = (char *)((long)&local_80 + 4);
              }
              bVar1 = Glob(pcVar7,local_70 & 0xffffffff,pcVar2,local_80 & 0xffffffff,true);
              local_58[uVar5] = bVar1;
            }
            uVar5 = uVar5 + 1;
            uVar4 = uVar4 + 0x10;
            uVar11 = uVar11 + 1;
            uVar6 = uVar5;
          } while (uVar8 != uVar5);
        }
      }
      local_38 = local_38 + 1;
      uVar5 = uVar6;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}